

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToasterUnix.h
# Opt level: O0

int __thiscall PixelToaster::UnixDisplay::close(UnixDisplay *this,int __fd)

{
  int iVar1;
  UnixDisplay *this_local;
  
  if (this->image_ != (XImage *)0x0) {
    (*(this->image_->f).destroy_image)(this->image_);
    this->image_ = (XImage *)0x0;
  }
  if ((this->display_ != (Display *)0x0) && (this->window_ != 0)) {
    __fd = (int)this->window_;
    XDestroyWindow(this->display_);
    this->window_ = 0;
  }
  if (this->display_ != (Display *)0x0) {
    XCloseDisplay(this->display_);
    this->display_ = (Display *)0x0;
  }
  iVar1 = DisplayAdapter::close(&this->super_DisplayAdapter,__fd);
  return iVar1;
}

Assistant:

void close() override
    {
        if (image_)
        {
            XDestroyImage(image_);
            image_ = 0;
        }

        if (display_ && window_)
        {
            XDestroyWindow(display_, window_);
            window_ = 0;
        }

        if (display_)
        {
            XCloseDisplay(display_);
            display_ = 0;
        }

        DisplayAdapter::close(); // note: this calls our virtual defaults method
    }